

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdAddBlindTxInData(void *handle,void *blind_handle,char *txid,uint32_t vout,char *asset_string,
                       char *asset_blind_factor,char *value_blind_factor,int64_t value_satoshi,
                       char *asset_key,char *token_key)

{
  pointer pcVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  bool bVar4;
  CfdException *pCVar5;
  Amount AVar6;
  allocator local_189;
  ConfidentialAssetId local_188;
  undefined1 local_158 [16];
  char local_148 [16];
  void *local_138;
  undefined1 local_130 [224];
  _func_int **local_50;
  pointer puStack_48;
  pointer local_40;
  pointer local_38;
  
  local_138 = handle;
  cfd::Initialize();
  pcVar1 = local_130 + 0x10;
  local_130._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"BlindTxData","");
  cfd::capi::CheckBuffer(blind_handle,(string *)local_130);
  if ((pointer)local_130._0_8_ != pcVar1) {
    operator_delete((void *)local_130._0_8_);
  }
  if (*(long *)((long)blind_handle + 0x10) == 0) {
    local_130._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_130._8_4_ = 0x49c;
    local_130._16_8_ = "CfdAddBlindTxInData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_130,kCfdLogLevelWarning,"buffer state is illegal.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"Failed to parameter. buffer state is illegal.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_130);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar4 = cfd::capi::IsEmptyString(txid);
  if (bVar4) {
    local_130._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_130._8_4_ = 0x4a2;
    local_130._16_8_ = "CfdAddBlindTxInData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_130,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_130);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar4 = cfd::capi::IsEmptyString(asset_string);
  if (!bVar4) {
    cfd::api::TxInBlindParameters::TxInBlindParameters((TxInBlindParameters *)local_130);
    std::__cxx11::string::string((string *)local_158,txid,&local_189);
    cfd::core::Txid::Txid((Txid *)&local_188,(string *)local_158);
    cfd::core::Txid::operator=((Txid *)local_130,(Txid *)&local_188);
    local_188._vptr_ConfidentialAssetId = (_func_int **)&PTR__Txid_00723450;
    if (local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((char *)local_158._0_8_ != local_148) {
      operator_delete((void *)local_158._0_8_);
    }
    local_130._32_4_ = vout;
    std::__cxx11::string::string((string *)local_158,asset_string,&local_189);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_188,(string *)local_158);
    cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(local_130 + 0x28),&local_188);
    local_188._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
    if (local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((char *)local_158._0_8_ != local_148) {
      operator_delete((void *)local_158._0_8_);
    }
    AVar6 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
    local_158._0_8_ = AVar6.amount_;
    local_158[8] = AVar6.ignore_check_;
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&local_188,(Amount *)local_158);
    cfd::core::ConfidentialValue::operator=
              ((ConfidentialValue *)(local_130 + 0x90),(ConfidentialValue *)&local_188);
    local_188._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_00723840;
    if (local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    bVar4 = cfd::capi::IsEmptyString(asset_blind_factor);
    if (bVar4) {
      local_158._0_8_ = local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,
                 "0000000000000000000000000000000000000000000000000000000000000000","");
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_188,(string *)local_158);
      cfd::core::BlindFactor::operator=((BlindFactor *)(local_130 + 0x50),(BlindFactor *)&local_188)
      ;
    }
    else {
      std::__cxx11::string::string((string *)local_158,asset_blind_factor,&local_189);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_188,(string *)local_158);
      cfd::core::BlindFactor::operator=((BlindFactor *)(local_130 + 0x50),(BlindFactor *)&local_188)
      ;
    }
    local_188._vptr_ConfidentialAssetId = (_func_int **)&PTR__BlindFactor_00723500;
    if (local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((char *)local_158._0_8_ != local_148) {
      operator_delete((void *)local_158._0_8_);
    }
    bVar4 = cfd::capi::IsEmptyString(value_blind_factor);
    if (bVar4) {
      local_158._0_8_ = local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,
                 "0000000000000000000000000000000000000000000000000000000000000000","");
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_188,(string *)local_158);
      cfd::core::BlindFactor::operator=((BlindFactor *)(local_130 + 0x70),(BlindFactor *)&local_188)
      ;
    }
    else {
      std::__cxx11::string::string((string *)local_158,value_blind_factor,&local_189);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_188,(string *)local_158);
      cfd::core::BlindFactor::operator=((BlindFactor *)(local_130 + 0x70),(BlindFactor *)&local_188)
      ;
    }
    local_188._vptr_ConfidentialAssetId = (_func_int **)&PTR__BlindFactor_00723500;
    if (local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((char *)local_158._0_8_ != local_148) {
      operator_delete((void *)local_158._0_8_);
    }
    local_130[0xb8] = false;
    bVar4 = cfd::capi::IsEmptyString(asset_key);
    if (!bVar4) {
      local_130[0xb8] = true;
      std::__cxx11::string::string((string *)local_158,asset_key,&local_189);
      cfd::core::Privkey::Privkey((Privkey *)&local_188,(string *)local_158,kMainnet,true);
      uVar2 = local_130._192_8_;
      local_130._192_8_ = local_188._vptr_ConfidentialAssetId;
      local_130._200_8_ =
           local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_130._208_8_ =
           local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_188._vptr_ConfidentialAssetId = (_func_int **)0x0;
      local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((_func_int **)uVar2 == (_func_int **)0x0) {
        local_130._216_8_ =
             local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        operator_delete((void *)uVar2);
        local_130._216_8_ =
             local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_188._vptr_ConfidentialAssetId != (_func_int **)0x0) {
          operator_delete(local_188._vptr_ConfidentialAssetId);
        }
      }
      if ((char *)local_158._0_8_ != local_148) {
        operator_delete((void *)local_158._0_8_);
      }
    }
    bVar4 = cfd::capi::IsEmptyString(token_key);
    if (!bVar4) {
      local_130[0xb8] = true;
      std::__cxx11::string::string((string *)local_158,token_key,&local_189);
      cfd::core::Privkey::Privkey((Privkey *)&local_188,(string *)local_158,kMainnet,true);
      pp_Var3 = local_50;
      local_50 = local_188._vptr_ConfidentialAssetId;
      puStack_48 = local_188.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      local_40 = local_188.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_188._vptr_ConfidentialAssetId = (_func_int **)0x0;
      local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pp_Var3 == (_func_int **)0x0) {
        local_38 = local_188.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      }
      else {
        operator_delete(pp_Var3);
        local_38 = local_188.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        if (local_188._vptr_ConfidentialAssetId != (_func_int **)0x0) {
          operator_delete(local_188._vptr_ConfidentialAssetId);
        }
      }
      if ((char *)local_158._0_8_ != local_148) {
        operator_delete((void *)local_158._0_8_);
      }
    }
    std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>::
    push_back(*(vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
                **)((long)blind_handle + 0x10),(value_type *)local_130);
    if (local_50 != (_func_int **)0x0) {
      operator_delete(local_50);
    }
    if ((_func_int **)local_130._192_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_130._192_8_);
    }
    local_130._144_8_ = &PTR__ConfidentialValue_00723840;
    if ((pointer)local_130._152_8_ != (pointer)0x0) {
      operator_delete((void *)local_130._152_8_);
    }
    local_130._112_8_ = &PTR__BlindFactor_00723500;
    if ((pointer)local_130._120_8_ != (pointer)0x0) {
      operator_delete((void *)local_130._120_8_);
    }
    local_130._80_8_ = &PTR__BlindFactor_00723500;
    if ((pointer)local_130._88_8_ != (pointer)0x0) {
      operator_delete((void *)local_130._88_8_);
    }
    local_130._40_8_ = &PTR__ConfidentialAssetId_00723760;
    if ((pointer)local_130._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_130._48_8_);
    }
    local_130._0_8_ = &PTR__Txid_00723450;
    if ((void *)CONCAT44(local_130._12_4_,local_130._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_130._12_4_,local_130._8_4_));
    }
    return 0;
  }
  local_130._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_130._8_4_ = 0x4a8;
  local_130._16_8_ = "CfdAddBlindTxInData";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_130,kCfdLogLevelWarning,"asset is null or empty.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_130._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"Failed to parameter. asset is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_130);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddBlindTxInData(
    void* handle, void* blind_handle, const char* txid, uint32_t vout,
    const char* asset_string, const char* asset_blind_factor,
    const char* value_blind_factor, int64_t value_satoshi,
    const char* asset_key, const char* token_key) {
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->txin_blind_keys == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    TxInBlindParameters params;
    params.txid = Txid(txid);
    params.vout = vout;
    params.blind_param.asset = ConfidentialAssetId(asset_string);
    params.blind_param.value =
        ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    if (IsEmptyString(asset_blind_factor)) {
      params.blind_param.abf = BlindFactor(kEmpty32Bytes);
    } else {
      params.blind_param.abf = BlindFactor(asset_blind_factor);
    }
    if (IsEmptyString(value_blind_factor)) {
      params.blind_param.vbf = BlindFactor(kEmpty32Bytes);
    } else {
      params.blind_param.vbf = BlindFactor(value_blind_factor);
    }

    params.is_issuance = false;
    if (!IsEmptyString(asset_key)) {
      params.is_issuance = true;
      params.issuance_key.asset_key = Privkey(asset_key);
    }
    if (!IsEmptyString(token_key)) {
      params.is_issuance = true;
      params.issuance_key.token_key = Privkey(token_key);
    }

    buffer->txin_blind_keys->push_back(params);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}